

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_replaceAString_success_oldSmallerLengthThanRep_bufferExpanded_fn(int _i)

{
  AString string_00;
  AString string_01;
  AString string_02;
  bool bVar1;
  int iVar2;
  char *in_stack_fffffffffffffe20;
  uintmax_t _ck_y_9;
  uintmax_t _ck_x_12;
  uintmax_t _ck_y_8;
  uintmax_t _ck_x_11;
  char *_ck_y_q_2;
  char *_ck_x_q_2;
  char *_ck_y_s_2;
  char *_ck_x_s_2;
  char *_ck_y_7;
  char *_ck_x_10;
  void *_ck_x_9;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_8;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_7;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_4;
  char *_ck_x_6;
  void *_ck_x_5;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_4;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_3;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_2;
  void *_ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  AString rep;
  AString old;
  AString string;
  int _i_local;
  
  private_ACUtilsTest_AString_constructTestString((AString *)&old.buffer,"xy012xy",8);
  private_ACUtilsTest_AString_constructTestString((AString *)&rep.buffer,"xy",2);
  private_ACUtilsTest_AString_constructTestString((AString *)&_ck_x,"abc",3);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  bVar1 = AString_replaceAString((AString *)&old.buffer,(AString *)&rep.buffer,(AString *)&_ck_x,0);
  if (bVar1 == false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x809,"Assertion \'AString_replaceAString(&string, &old, &rep, 0)\' failed",0
                     );
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x809);
  if (string.size != 0x10) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x80a,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (16)",
                      "(string).capacity",string.size,"(16)",0x10,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x80a);
  if (string.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x80a,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x80a);
  if (string.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar2 = strcmp("abc012abc",(char *)string.capacity);
    _ck_y_s = (char *)string.capacity;
    if (iVar2 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x80a);
      if (string.deallocator != (ACUtilsDeallocator)0x9) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x80a,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).size == strlen(\"abc012abc\")","(string).size",
                          string.deallocator,"strlen(\"abc012abc\")",9,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x80a);
      if (old.size != 2) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x80b,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju","(old).capacity == (2)",
                          "(old).capacity",old.size,"(2)",2,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x80b);
      if (old.capacity == 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x80b,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) (old).buffer != NULL",
                          "(void*) (old).buffer",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x80b);
      _ck_y_s_1 = (char *)old.capacity;
      if (old.capacity == 0) {
        _ck_y_q_1 = "";
        _ck_y_s_1 = "(null)";
      }
      else {
        _ck_y_q_1 = "\"";
        iVar2 = strcmp("xy",(char *)old.capacity);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x80b);
          if (old.deallocator != (ACUtilsDeallocator)0x2) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x80b,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(old).size == strlen(\"xy\")","(old).size",old.deallocator,
                              "strlen(\"xy\")",2,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x80b);
          if (rep.size != 3) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x80c,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(rep).capacity == (3)","(rep).capacity",rep.size,"(3)",3,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x80c);
          if (rep.capacity == 0) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x80c,"Assertion \'_ck_x != NULL\' failed",
                              "Assertion \'%s\' failed: %s == %#x","(void*) (rep).buffer != NULL",
                              "(void*) (rep).buffer",0,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x80c);
          _ck_y_s_2 = (char *)rep.capacity;
          if (rep.capacity == 0) {
            _ck_y_q_2 = "";
            _ck_y_s_2 = "(null)";
          }
          else {
            _ck_y_q_2 = "\"";
            iVar2 = strcmp("abc",(char *)rep.capacity);
            if (iVar2 == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x80c);
              if (rep.deallocator != (ACUtilsDeallocator)0x3) {
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x80c,"Assertion \'_ck_x == _ck_y\' failed",
                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                  "(rep).size == strlen(\"abc\")","(rep).size",rep.deallocator,
                                  "strlen(\"abc\")",3,0);
              }
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x80c);
              if (private_ACUtilsTest_AString_reallocCount == 1) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x80d);
                string_00.deallocator = (ACUtilsDeallocator)0x9;
                string_00.reallocator = string.reallocator;
                string_00.size = 0x10;
                string_00.capacity = string.capacity;
                string_00.buffer = in_stack_fffffffffffffe20;
                private_ACUtilsTest_AString_destructTestString(string_00);
                string_01.deallocator = old.deallocator;
                string_01.reallocator = old.reallocator;
                string_01.size = old.size;
                string_01.capacity = old.capacity;
                string_01.buffer = in_stack_fffffffffffffe20;
                private_ACUtilsTest_AString_destructTestString(string_01);
                string_02.deallocator = rep.deallocator;
                string_02.reallocator = rep.reallocator;
                string_02.size = rep.size;
                string_02.capacity = rep.capacity;
                string_02.buffer = in_stack_fffffffffffffe20;
                private_ACUtilsTest_AString_destructTestString(string_02);
                return;
              }
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x80d,"Assertion \'_ck_x == _ck_y\' failed",
                                "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                "private_ACUtilsTest_AString_reallocCount == (1)",
                                "private_ACUtilsTest_AString_reallocCount",
                                private_ACUtilsTest_AString_reallocCount,"(1)",1,0);
            }
          }
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x80c,
                            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                            ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                            "(rep).buffer == (\"abc\")","(rep).buffer",_ck_y_q_2,_ck_y_s_2,_ck_y_q_2
                            ,"(\"abc\")","\"","abc","\"",0);
        }
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x80b,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(old).buffer == (\"xy\")","(old).buffer",_ck_y_q_1,_ck_y_s_1,_ck_y_q_1,
                        "(\"xy\")","\"","xy","\"",0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x80a,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(string).buffer == (\"abc012abc\")","(string).buffer",_ck_y_q,_ck_y_s,_ck_y_q,
                    "(\"abc012abc\")","\"","abc012abc","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceAString_success_oldSmallerLengthThanRep_bufferExpanded)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("xy012xy", 8);
    struct AString old = private_ACUtilsTest_AString_constructTestString("xy", 2);
    struct AString rep = private_ACUtilsTest_AString_constructTestString("abc", 3);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceAString(&string, &old, &rep, 0));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abc012abc", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(old, "xy", 2);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(rep, "abc", 3);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(1);
    private_ACUtilsTest_AString_destructTestString(string);
    private_ACUtilsTest_AString_destructTestString(old);
    private_ACUtilsTest_AString_destructTestString(rep);
}